

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::CategoricalCrossEntropyLossLayer::MergePartialFromCodedStream
          (CategoricalCrossEntropyLossLayer *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  int iVar6;
  char *field_name;
  int iVar7;
  ulong uVar8;
  pointer data;
  ArenaStringPtr *this_01;
  
  this_00 = &this->target_;
  this_01 = &this->input_;
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00145e79;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00145e79:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar8 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar4 | uVar8;
    }
    uVar4 = (uint32)uVar8;
    iVar6 = 6;
    iVar7 = iVar6;
    if ((uVar8 & 0x100000000) == 0) {
LAB_00145f4c:
      iVar7 = 7;
      if ((uVar4 & 7) != 4 && uVar4 != 0) {
        bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
LAB_00145f6a:
        iVar7 = iVar6;
        if (bVar3 != false) {
          iVar7 = 0;
        }
      }
    }
    else {
      uVar5 = (uint)(uVar8 >> 3) & 0x1fffffff;
      if (uVar5 != 2) {
        if ((uVar5 != 1) || ((char)uVar8 != '\n')) goto LAB_00145f4c;
        if (this_01->ptr_ ==
            (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_01,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,this_01->ptr_);
        if (!bVar3) goto LAB_00145f73;
        data = (this_01->ptr_->_M_dataplus)._M_p;
        iVar7 = (int)this_01->ptr_->_M_string_length;
        field_name = "CoreML.Specification.CategoricalCrossEntropyLossLayer.input";
LAB_00145f45:
        bVar3 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (data,iVar7,PARSE,field_name);
        goto LAB_00145f6a;
      }
      if ((char)uVar8 != '\x12') goto LAB_00145f4c;
      if (this_00->ptr_ ==
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_00,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      }
      bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,this_00->ptr_);
      if (bVar3) {
        data = (this_00->ptr_->_M_dataplus)._M_p;
        iVar7 = (int)this_00->ptr_->_M_string_length;
        field_name = "CoreML.Specification.CategoricalCrossEntropyLossLayer.target";
        goto LAB_00145f45;
      }
    }
LAB_00145f73:
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool CategoricalCrossEntropyLossLayer::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CategoricalCrossEntropyLossLayer)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string input = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_input()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->input().data(), this->input().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CategoricalCrossEntropyLossLayer.input"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string target = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_target()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->target().data(), this->target().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CategoricalCrossEntropyLossLayer.target"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CategoricalCrossEntropyLossLayer)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CategoricalCrossEntropyLossLayer)
  return false;
#undef DO_
}